

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

void __thiscall iDynTree::LinkAccArray::LinkAccArray(LinkAccArray *this,Model *model)

{
  Model *in_RDI;
  LinkAccArray *in_stack_ffffffffffffffe0;
  
  std::vector<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>::vector
            ((vector<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_> *)0x4382ac);
  resize(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

LinkAccArray::LinkAccArray(const Model& model)
{
    resize(model);
}